

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

ssize_t __thiscall iqnet::Socket::send(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  network_error *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_49;
  string local_48;
  int local_24;
  void *pvStack_20;
  int ret;
  size_t len_local;
  char *data_local;
  Socket *this_local;
  
  len_local = CONCAT44(in_register_00000034,__fd);
  pvStack_20 = __buf;
  data_local = (char *)this;
  sVar1 = ::send(this->sock,(void *)len_local,(long)(int)__buf,0x4000);
  local_24 = (int)sVar1;
  if (local_24 == -1) {
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Socket::send",&local_49)
    ;
    network_error::network_error(this_00,&local_48,true,0);
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  return (long)local_24;
}

Assistant:

size_t Socket::send( const char* data, size_t len )
{
  int ret = ::send( sock, data, static_cast<int>(len), IQXMLRPC_NOPIPE);

  if( ret == -1 )
    throw network_error( "Socket::send" );

  return static_cast<size_t>(ret);
}